

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void pstore::serialize::flood<_1l>(span<unsigned_char,__1L> sp)

{
  value_type_conflict1 vVar1;
  bool bVar2;
  index_type iVar3;
  const_reference pvVar4;
  reference ptVar5;
  size_type sVar6;
  size_type local_88;
  size_t index;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  long local_40;
  index_type uint32_count;
  iterator end;
  iterator it;
  span<unsigned_char,__1L> sp_local;
  
  it.index_ = (ptrdiff_t)sp.storage_.super_extent_type<_1L>.size_;
  std::begin<pstore::gsl::span<unsigned_char,_1l>>((span<unsigned_char,__1L> *)&end.index_);
  std::end<pstore::gsl::span<unsigned_char,_1l>>((span<unsigned_char,__1L> *)&uint32_count);
  iVar3 = gsl::span<unsigned_char,_-1L>::size((span<unsigned_char,__1L> *)&it.index_);
  for (local_40 = iVar3 / 4; 0 < local_40; local_40 = local_40 + -1) {
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&flood<-1L>::deadbeef,0);
    vVar1 = *pvVar4;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_50,(int)&end + 8);
    ptVar5 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_50);
    *ptVar5 = vVar1;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&flood<-1L>::deadbeef,1);
    vVar1 = *pvVar4;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_60,(int)&end + 8);
    ptVar5 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_60);
    *ptVar5 = vVar1;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&flood<-1L>::deadbeef,2);
    vVar1 = *pvVar4;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_70,(int)&end + 8);
    ptVar5 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_70);
    *ptVar5 = vVar1;
    pvVar4 = std::array<unsigned_char,_4UL>::operator[](&flood<-1L>::deadbeef,3);
    vVar1 = *pvVar4;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&index,(int)&end + 8);
    ptVar5 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&index);
    *ptVar5 = vVar1;
  }
  local_88 = 0;
  while( true ) {
    bVar2 = gsl::details::operator!=
                      ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&end.index_,
                       (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&uint32_count)
    ;
    if (!bVar2) break;
    pvVar4 = std::array<unsigned_char,_4UL>::at(&flood<-1L>::deadbeef,local_88);
    vVar1 = *pvVar4;
    ptVar5 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&end.index_);
    *ptVar5 = vVar1;
    sVar6 = std::array<unsigned_char,_4UL>::size(&flood<-1L>::deadbeef);
    local_88 = (local_88 + 1) % sVar6;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)&end.index_);
  }
  return;
}

Assistant:

void flood (gsl::span<std::uint8_t, SpanExtent> sp) noexcept {
            static std::array<std::uint8_t, 4> const deadbeef{{0xDE, 0xAD, 0xBE, 0xEF}};

            auto it = std::begin (sp);
            auto end = std::end (sp);

            for (auto uint32_count = sp.size () / 4U; uint32_count > 0U; --uint32_count) {
                *(it++) = deadbeef[0];
                *(it++) = deadbeef[1];
                *(it++) = deadbeef[2];
                *(it++) = deadbeef[3];
            }

            auto index = std::size_t{0};
            for (; it != end; ++it) {
                *it = deadbeef.at (index);
                index = (index + 1) % deadbeef.size ();
            }
        }